

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int read_number(lua_State *L,FILE *f)

{
  int iVar1;
  lconv *plVar2;
  ushort **ppuVar3;
  size_t sVar4;
  char *set;
  char local_10a [2];
  int local_108;
  int iStack_104;
  char decp [2];
  int hex;
  int count;
  RN rn;
  FILE *f_local;
  lua_State *L_local;
  
  iStack_104 = 0;
  local_108 = 0;
  rn.f._4_4_ = 0;
  _hex = (FILE *)f;
  rn._216_8_ = f;
  plVar2 = localeconv();
  local_10a[0] = *plVar2->decimal_point;
  local_10a[1] = 0x2e;
  do {
    rn.f._0_4_ = getc(_hex);
    ppuVar3 = __ctype_b_loc();
  } while (((*ppuVar3)[(int)rn.f] & 0x2000) != 0);
  test2((RN *)&hex,"-+");
  iVar1 = test2((RN *)&hex,"00");
  if (iVar1 != 0) {
    iVar1 = test2((RN *)&hex,"xX");
    if (iVar1 == 0) {
      iStack_104 = 1;
    }
    else {
      local_108 = 1;
    }
  }
  iVar1 = readdigits((RN *)&hex,local_108);
  iStack_104 = iVar1 + iStack_104;
  iVar1 = test2((RN *)&hex,local_10a);
  if (iVar1 != 0) {
    iVar1 = readdigits((RN *)&hex,local_108);
    iStack_104 = iVar1 + iStack_104;
  }
  if (0 < iStack_104) {
    set = "eE";
    if (local_108 != 0) {
      set = "pP";
    }
    iVar1 = test2((RN *)&hex,set);
    if (iVar1 != 0) {
      test2((RN *)&hex,"-+");
      readdigits((RN *)&hex,0);
    }
  }
  ungetc((int)rn.f,_hex);
  rn.buff[(long)rn.f._4_4_ + -8] = '\0';
  sVar4 = lua_stringtonumber(L,(char *)&rn.c);
  if (sVar4 == 0) {
    lua_pushnil(L);
  }
  L_local._4_4_ = (uint)(sVar4 != 0);
  return L_local._4_4_;
}

Assistant:

static int read_number (lua_State *L, FILE *f) {
  RN rn;
  int count = 0;
  int hex = 0;
  char decp[2];
  rn.f = f; rn.n = 0;
  decp[0] = lua_getlocaledecpoint();  /* get decimal point from locale */
  decp[1] = '.';  /* always accept a dot */
  l_lockfile(rn.f);
  do { rn.c = l_getc(rn.f); } while (isspace(rn.c));  /* skip spaces */
  test2(&rn, "-+");  /* optional sign */
  if (test2(&rn, "00")) {
    if (test2(&rn, "xX")) hex = 1;  /* numeral is hexadecimal */
    else count = 1;  /* count initial '0' as a valid digit */
  }
  count += readdigits(&rn, hex);  /* integral part */
  if (test2(&rn, decp))  /* decimal point? */
    count += readdigits(&rn, hex);  /* fractional part */
  if (count > 0 && test2(&rn, (hex ? "pP" : "eE"))) {  /* exponent mark? */
    test2(&rn, "-+");  /* exponent sign */
    readdigits(&rn, 0);  /* exponent digits */
  }
  ungetc(rn.c, rn.f);  /* unread look-ahead char */
  l_unlockfile(rn.f);
  rn.buff[rn.n] = '\0';  /* finish string */
  if (l_likely(lua_stringtonumber(L, rn.buff)))
    return 1;  /* ok, it is a valid number */
  else {  /* invalid format */
   lua_pushnil(L);  /* "result" to be removed */
   return 0;  /* read fails */
  }
}